

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O3

bool __thiscall Time::operator!=(Time *this,Time *other)

{
  bool bVar1;
  
  bVar1 = true;
  if ((((((this->sec == other->sec) && (this->min == other->min)) && (this->hour == other->hour)) &&
       ((this->day == other->day && (this->month == other->month)))) &&
      ((this->year == other->year && ((this->wday == other->wday && (this->yday == other->yday))))))
     && (this->dst == other->dst)) {
    bVar1 = this->utc != other->utc;
  }
  return bVar1;
}

Assistant:

bool Time::operator!=(const Time& other) const
{
  return sec != other.sec ||
    min != other.min ||
    hour != other.hour ||
    day != other.day ||
    month != other.month ||
    year != other.year ||
    wday != other.wday ||
    yday != other.yday ||
    dst != other.dst ||
    utc != other.utc;
}